

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  int iVar5;
  
  iVar5 = 0;
  do {
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001539d1:
      if (s->img_buffer_end <= s->img_buffer) {
        return iVar5;
      }
    }
    else {
      iVar3 = (*(s->io).eof)(s->io_user_data);
      if (iVar3 != 0) {
        if (s->read_from_callbacks == 0) {
          return iVar5;
        }
        goto LAB_001539d1;
      }
    }
    bVar1 = *c;
    if ((byte)(bVar1 - 0x3a) < 0xf6) {
      return iVar5;
    }
    psVar4 = s->img_buffer;
    if (psVar4 < s->img_buffer_end) {
LAB_00153a14:
      s->img_buffer = psVar4 + 1;
      sVar2 = *psVar4;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar4 = s->img_buffer;
        goto LAB_00153a14;
      }
      sVar2 = '\0';
    }
    iVar5 = (uint)bVar1 + iVar5 * 10 + -0x30;
    *c = sVar2;
  } while( true );
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
   }

   return value;
}